

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pattern.h
# Opt level: O1

void ZXing::GetPatternRow<ZXing::StrideIter<unsigned_char_const*>>
               (Range<ZXing::StrideIter<const_unsigned_char_*>_> b_row,PatternRow *p_row)

{
  pointer __s;
  pointer puVar1;
  long lVar2;
  
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (p_row,(long)((int)(((long)b_row._end.pos - (long)b_row._begin.pos) /
                               (long)b_row._end.stride) + 2));
  __s = (p_row->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
        super__Vector_impl_data._M_start;
  puVar1 = (p_row->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (__s != puVar1) {
    memset(__s,0,((long)puVar1 + (-2 - (long)__s) & 0xfffffffffffffffeU) + 2);
  }
  lVar2 = (long)b_row._begin.stride;
  puVar1 = __s + (*b_row._begin.pos != '\0');
  for (; b_row._begin.pos + lVar2 != b_row._end.pos; b_row._begin.pos = b_row._begin.pos + lVar2) {
    *puVar1 = *puVar1 + 1;
    puVar1 = puVar1 + (b_row._begin.pos[lVar2] != *b_row._begin.pos);
  }
  *puVar1 = *puVar1 + 1;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (p_row,((long)((long)puVar1 + ((ulong)(*b_row._begin.pos != '\0') * 2 - (long)__s)) >> 1
                   ) + 1);
  return;
}

Assistant:

void GetPatternRow(Range<I> b_row, PatternRow& p_row)
{
	// TODO: if reactivating the bit-packed array (!ZX_FAST_BIT_STORAGE) should be of interest then the following code could be
	// considerably speed up by using a specialized variant along the lines of the old BitArray::getNextSetTo() function that
	// was removed between 1.4 and 2.0.

#if 0
	p_row.reserve(64);
	p_row.clear();

	auto lastPos = b_row.begin();
	if (*lastPos)
		p_row.push_back(0); // first value is number of white pixels, here 0

	for (auto p = b_row.begin() + 1; p < b_row.end(); ++p)
		if (bool(*p) != bool(*lastPos))
			p_row.push_back(p - std::exchange(lastPos, p));

	p_row.push_back(b_row.end() - lastPos);

	if (*lastPos)
		p_row.push_back(0); // last value is number of white pixels, here 0
#else
	p_row.resize(b_row.size() + 2);
	std::fill(p_row.begin(), p_row.end(), 0);

	auto bitPos = b_row.begin();
	const auto bitPosEnd = b_row.end();
	auto intPos = p_row.data();

	if (*bitPos)
		intPos++; // first value is number of white pixels, here 0

	// The following code as been observed to cause a speedup of up to 30% on large images on an AVX cpu
	// and on an a Google Pixel 3 Android phone. Your mileage may vary.
	if constexpr (std::is_pointer_v<I> && sizeof(I) == 8 && sizeof(std::remove_pointer_t<I>) == 1) {
		using simd_t = uint64_t;
		while (bitPos < bitPosEnd - sizeof(simd_t)) {
			auto asSimd0 = BitHacks::LoadU<simd_t>(bitPos);
			auto asSimd1 = BitHacks::LoadU<simd_t>(bitPos + 1);
			auto z = asSimd0 ^ asSimd1;
			if (z) {
#if __BYTE_ORDER__ == __ORDER_LITTLE_ENDIAN__
				int step = BitHacks::NumberOfTrailingZeros(z) / 8 + 1;
#else
				int step = BitHacks::NumberOfLeadingZeros(z) / 8 + 1;
#endif
				(*intPos++) += step;
				bitPos += step;
			} else {
				(*intPos) += sizeof(simd_t);
				bitPos += sizeof(simd_t);
			}
		}
	}

	while (++bitPos != bitPosEnd) {
		++(*intPos);
		intPos += bitPos[0] != bitPos[-1];
	}
	++(*intPos);

	if (bitPos[-1])
		intPos++;

	p_row.resize(intPos - p_row.data() + 1);
#endif
}